

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_sse41_128_64.c
# Opt level: O1

parasail_result_t *
parasail_nw_stats_table_scan_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long *plVar1;
  size_t *psVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  long lVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  uint uVar17;
  int iVar18;
  parasail_result_t *ppVar19;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int64_t *ptr_06;
  size_t sVar20;
  size_t sVar21;
  size_t len;
  size_t sVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  undefined8 extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  size_t sVar28;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  ulong uVar32;
  int32_t segNum;
  int iVar33;
  int iVar34;
  ulong uVar35;
  ulong uVar36;
  __m128i *palVar37;
  ulong uVar38;
  size_t sVar39;
  undefined1 auVar40 [12];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar41 [16];
  size_t sVar46;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  size_t sVar47;
  undefined1 auVar48 [12];
  __m128i_64_t B;
  undefined1 auVar49 [16];
  size_t sVar52;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  long lVar53;
  undefined1 auVar54 [12];
  long lVar58;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  size_t sVar59;
  undefined1 auVar60 [12];
  __m128i_64_t B_4;
  size_t sVar62;
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  __m128i_64_t B_5;
  undefined1 auVar69 [16];
  __m128i_64_t B_6;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  __m128i_64_t B_2;
  undefined1 auVar74 [16];
  __m128i_64_t B_3;
  undefined1 auVar75 [16];
  int64_t iVar76;
  size_t sVar77;
  undefined1 auVar78 [16];
  size_t sVar79;
  __m128i_64_t B_1;
  undefined1 in_XMM15 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  __m128i alVar82;
  __m128i alVar83;
  __m128i alVar84;
  __m128i alVar85;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i_64_t h;
  undefined1 local_1f8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  long local_158;
  long local_150;
  size_t sStack_140;
  size_t sStack_130;
  long local_128;
  long lStack_120;
  size_t local_98;
  size_t sStack_90;
  ulong uStack_80;
  long local_58;
  long lStack_50;
  longlong local_48 [3];
  int iVar27;
  longlong extraout_RDX_00;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_table_scan_profile_sse41_128_64_cold_8();
  }
  else {
    pvVar3 = (profile->profile64).score;
    if (pvVar3 == (void *)0x0) {
      parasail_nw_stats_table_scan_profile_sse41_128_64_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_table_scan_profile_sse41_128_64_cold_6();
      }
      else {
        uVar17 = profile->s1Len;
        if ((int)uVar17 < 1) {
          parasail_nw_stats_table_scan_profile_sse41_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_table_scan_profile_sse41_128_64_cold_4();
        }
        else {
          uVar36 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_stats_table_scan_profile_sse41_128_64_cold_3();
          }
          else if (open < 0) {
            parasail_nw_stats_table_scan_profile_sse41_128_64_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_stats_table_scan_profile_sse41_128_64_cold_1();
          }
          else {
            iVar34 = uVar17 - 1;
            uVar31 = (ulong)uVar17 + 1 >> 1;
            iVar30 = (int)uVar31;
            uVar29 = iVar34 % iVar30;
            pvVar5 = (profile->profile64).matches;
            pvVar6 = (profile->profile64).similar;
            iVar33 = -open;
            iVar27 = ppVar4->min;
            uVar35 = 0x8000000000000000 - (long)iVar27;
            if (iVar27 != iVar33 && SBORROW4(iVar27,iVar33) == iVar27 + open < 0) {
              uVar35 = (ulong)(uint)open | 0x8000000000000000;
            }
            iVar27 = ppVar4->max;
            local_1a8._8_8_ = local_1a8._0_8_;
            local_1a8._0_8_ = (long)iVar27;
            ppVar19 = parasail_result_new_table3((uint)((ulong)uVar17 + 1) & 0x7ffffffe,s2Len);
            if (ppVar19 != (parasail_result_t *)0x0) {
              local_1c8._0_4_ = iVar33;
              ppVar19->flag = ppVar19->flag | 0x2830401;
              b = parasail_memalign___m128i(0x10,uVar31);
              b_00 = parasail_memalign___m128i(0x10,uVar31);
              b_01 = parasail_memalign___m128i(0x10,uVar31);
              b_02 = parasail_memalign___m128i(0x10,uVar31);
              ptr = parasail_memalign___m128i(0x10,uVar31);
              b_03 = parasail_memalign___m128i(0x10,uVar31);
              b_04 = parasail_memalign___m128i(0x10,uVar31);
              b_05 = parasail_memalign___m128i(0x10,uVar31);
              ptr_00 = parasail_memalign___m128i(0x10,uVar31);
              ptr_01 = parasail_memalign___m128i(0x10,uVar31);
              ptr_02 = parasail_memalign___m128i(0x10,uVar31);
              ptr_03 = parasail_memalign___m128i(0x10,uVar31);
              ptr_04 = parasail_memalign___m128i(0x10,uVar31);
              ptr_05 = parasail_memalign___m128i(0x10,uVar31);
              ptr_06 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1));
              alVar82[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              alVar82[1]._0_1_ =
                   (ptr_02 == (__m128i *)0x0 ||
                   (ptr_01 == (__m128i *)0x0 || (ptr_00 == (__m128i *)0x0 || b_05 == (__m128i *)0x0)
                   )) || ((b_04 == (__m128i *)0x0 ||
                          (b_03 == (__m128i *)0x0 || ptr == (__m128i *)0x0)) ||
                         ((b_02 == (__m128i *)0x0 || b_01 == (__m128i *)0x0) ||
                         (b_00 == (__m128i *)0x0 || b == (__m128i *)0x0)));
              if ((ptr_06 != (int64_t *)0x0 &&
                  (ptr_05 != (__m128i *)0x0 &&
                  (ptr_04 != (__m128i *)0x0 && ptr_03 != (__m128i *)0x0))) &&
                  ((ptr_02 != (__m128i *)0x0 &&
                   (ptr_01 != (__m128i *)0x0 && (ptr_00 != (__m128i *)0x0 && b_05 != (__m128i *)0x0)
                   )) && ((b_04 != (__m128i *)0x0 &&
                          (b_03 != (__m128i *)0x0 && ptr != (__m128i *)0x0)) &&
                         ((b_02 != (__m128i *)0x0 && b_01 != (__m128i *)0x0) &&
                         (b_00 != (__m128i *)0x0 && b != (__m128i *)0x0))))) {
                iVar16 = s2Len + -1;
                uVar38 = (ulong)(uint)gap;
                sVar20 = uVar35 + 1;
                len = 0x7ffffffffffffffe - (long)iVar27;
                auVar72._8_4_ = (int)sVar20;
                auVar72._0_8_ = sVar20;
                auVar72._12_4_ = (int)(sVar20 >> 0x20);
                auVar65._8_4_ = (int)len;
                auVar65._0_8_ = len;
                auVar65._12_4_ = (int)(len >> 0x20);
                alVar82[0] = uVar31;
                sVar22 = len;
                parasail_memset___m128i(b_03,alVar82,len);
                alVar83[1] = extraout_RDX_00;
                alVar83[0] = uVar31;
                parasail_memset___m128i(b_04,alVar83,sVar22);
                alVar84[1] = extraout_RDX_01;
                alVar84[0] = uVar31;
                parasail_memset___m128i(b_05,alVar84,sVar22);
                alVar85[1] = extraout_RDX_02;
                alVar85[0] = uVar31;
                parasail_memset___m128i(b,alVar85,sVar22);
                c[1] = extraout_RDX_03;
                c[0] = uVar31;
                parasail_memset___m128i(b_00,c,sVar22);
                c_00[1] = extraout_RDX_04;
                c_00[0] = uVar31;
                parasail_memset___m128i(b_01,c_00,sVar22);
                c_01[1] = extraout_RDX_05;
                c_01[0] = uVar31;
                parasail_memset___m128i(b_02,c_01,sVar22);
                uStack_80 = (ulong)(uint)gap;
                lVar53 = -(ulong)(uint)open;
                lVar58 = -(ulong)(uint)open;
                uVar17 = iVar30 - 1;
                lVar23 = (ulong)uVar17 << 4;
                auVar41 = pmovsxbq(extraout_XMM0,0x101);
                auVar49._8_4_ = 0xffffffff;
                auVar49._0_8_ = 0xffffffffffffffff;
                auVar49._12_4_ = 0xffffffff;
                uVar24 = uVar31;
                do {
                  plVar1 = (long *)((long)*ptr_04 + lVar23);
                  *plVar1 = lVar53;
                  plVar1[1] = lVar58;
                  *(undefined1 (*) [16])((long)*ptr_05 + lVar23) = auVar41;
                  lVar53 = lVar53 - uVar38;
                  lVar58 = lVar58 - uStack_80;
                  lVar25 = auVar41._8_8_;
                  auVar41._0_8_ = auVar41._0_8_ + 1;
                  auVar41._8_8_ = lVar25 - auVar49._8_8_;
                  lVar23 = lVar23 + -0x10;
                  iVar27 = (int)uVar24;
                  uVar26 = iVar27 - 1;
                  uVar24 = (ulong)uVar26;
                } while (uVar26 != 0 && 0 < iVar27);
                uVar24 = (ulong)(uint)gap;
                lVar53 = (long)iVar33;
                uVar32 = 0;
                sStack_130 = auVar65._8_8_;
                do {
                  lVar23 = 0;
                  lVar58 = lVar53;
                  do {
                    local_48[lVar23] = lVar58;
                    lVar23 = lVar23 + 1;
                    lVar58 = lVar58 - uVar31 * uVar24;
                  } while (lVar23 == 1);
                  ptr[uVar32][0] = local_48[0];
                  ptr[uVar32][1] = local_48[1];
                  uVar32 = uVar32 + 1;
                  lVar53 = lVar53 - uVar24;
                } while (uVar32 != uVar31);
                *ptr_06 = 0;
                lVar53 = (long)iVar33;
                uVar32 = 1;
                do {
                  ptr_06[uVar32] = lVar53;
                  uVar32 = uVar32 + 1;
                  lVar53 = lVar53 - uVar24;
                } while (s2Len + 1 != uVar32);
                palVar37 = ptr + uVar17;
                uVar24 = 1;
                if (1 < s2Len) {
                  uVar24 = uVar36;
                }
                lVar53 = (ulong)(iVar30 + (uint)(iVar30 == 0)) << 4;
                local_150 = uVar31 * uVar36 * 4;
                local_158 = 0;
                uVar31 = 0;
                sStack_140 = auVar72._8_8_;
                sStack_90 = sStack_140;
                sVar22 = len;
                local_98 = sVar20;
                do {
                  lStack_120 = b_04[uVar17][0];
                  lStack_50 = b_05[uVar17][0];
                  auVar78._8_4_ = (int)(*palVar37)[0];
                  auVar78._0_8_ = (*palVar37)[0];
                  auVar78._12_4_ = *(undefined4 *)((long)*palVar37 + 4);
                  local_128 = 0;
                  local_58 = 0;
                  lVar23 = (long)ppVar4->mapper[(byte)s2[uVar31]] * (long)iVar30 * 0x10;
                  sVar47 = sVar20 - (*ptr_04)[0];
                  sVar52 = sStack_140 - (*ptr_04)[1];
                  auVar65 = (undefined1  [16])0x0;
                  lVar25 = 0;
                  local_1f8 = (undefined1  [16])0x0;
                  local_1b8 = (undefined1  [16])0x0;
                  auVar72 = local_1c8;
                  sVar77 = sVar20;
                  sVar79 = sStack_140;
                  local_1c8._0_8_ = 0;
                  local_1c8._8_8_ = b_03[uVar17][0];
                  iVar76 = ptr_06[uVar31];
                  lVar58 = auVar78._8_8_;
                  do {
                    plVar1 = (long *)((long)*ptr + lVar25);
                    lVar7 = *plVar1;
                    lVar12 = plVar1[1];
                    auVar41 = *(undefined1 (*) [16])((long)*b_03 + lVar25);
                    plVar1 = (long *)((long)*b + lVar25);
                    sVar59 = lVar7 - (ulong)(uint)open;
                    sVar62 = lVar12 - (ulong)(uint)open;
                    sVar39 = *plVar1 - uVar38;
                    sVar46 = plVar1[1] - (ulong)(uint)gap;
                    sVar21 = sVar46;
                    if ((long)sVar46 < (long)sVar62) {
                      sVar21 = sVar62;
                    }
                    sVar28 = sVar39;
                    if ((long)sVar39 < (long)sVar59) {
                      sVar28 = sVar59;
                    }
                    auVar63._8_8_ = -(ulong)((long)sVar46 < (long)sVar62);
                    auVar63._0_8_ = -(ulong)((long)sVar39 < (long)sVar59);
                    auVar69 = pblendvb(*(undefined1 (*) [16])((long)*b_00 + lVar25),auVar41,auVar63)
                    ;
                    auVar49 = *(undefined1 (*) [16])((long)*b_04 + lVar25);
                    auVar70 = pblendvb(*(undefined1 (*) [16])((long)*b_01 + lVar25),auVar49,auVar63)
                    ;
                    auVar78 = *(undefined1 (*) [16])((long)*b_05 + lVar25);
                    auVar63 = pblendvb(*(undefined1 (*) [16])((long)*b_02 + lVar25),auVar78,auVar63)
                    ;
                    plVar1 = (long *)((long)*ptr_04 + lVar25);
                    sVar47 = sVar47 + *plVar1;
                    sVar52 = sVar52 + plVar1[1];
                    sVar39 = sVar52;
                    if ((long)sVar52 < (long)sVar79) {
                      sVar39 = sVar79;
                    }
                    sVar46 = sVar47;
                    if ((long)sVar47 < (long)sVar77) {
                      sVar46 = sVar77;
                    }
                    auVar61._8_8_ = -(ulong)((long)sVar52 < (long)sVar79);
                    auVar61._0_8_ = -(ulong)((long)sVar47 < (long)sVar77);
                    auVar50._0_8_ = -(ulong)(sVar47 == sVar77);
                    auVar50._8_8_ = -(ulong)(sVar52 == sVar79);
                    auVar50 = auVar50 | auVar61;
                    local_1b8 = pblendvb(auVar72,local_1b8,auVar50);
                    local_1f8 = pblendvb(local_1a8,local_1f8,auVar50);
                    plVar1 = (long *)((long)*ptr_05 + lVar25);
                    auVar80._0_8_ = in_XMM15._0_8_ + *plVar1;
                    auVar80._8_8_ = in_XMM15._8_8_ + plVar1[1];
                    auVar65 = pblendvb(auVar80,auVar65,auVar50);
                    plVar1 = (long *)((long)pvVar3 + lVar25 + lVar23);
                    sVar77 = iVar76 + *plVar1;
                    sVar79 = lVar58 + plVar1[1];
                    sVar52 = sVar21;
                    if ((long)sVar21 <= (long)sVar79) {
                      sVar52 = sVar79;
                    }
                    sVar47 = sVar28;
                    if ((long)sVar28 <= (long)sVar77) {
                      sVar47 = sVar77;
                    }
                    auVar42._8_8_ = -(ulong)((long)sVar79 < (long)sVar21);
                    auVar42._0_8_ = -(ulong)((long)sVar77 < (long)sVar28);
                    plVar1 = (long *)((long)pvVar5 + lVar25 + lVar23);
                    auVar75._0_8_ = local_1c8._0_8_ + *plVar1;
                    auVar75._8_8_ = local_1c8._8_8_ + plVar1[1];
                    auVar72 = pblendvb(auVar75,auVar69,auVar42);
                    plVar1 = (long *)((long)pvVar6 + lVar25 + lVar23);
                    auVar74._0_8_ = local_128 + *plVar1;
                    auVar74._8_8_ = lStack_120 + plVar1[1];
                    local_1a8 = pblendvb(auVar74,auVar70,auVar42);
                    auVar81._8_4_ = 0xffffffff;
                    auVar81._0_8_ = 0xffffffffffffffff;
                    auVar81._12_4_ = 0xffffffff;
                    auVar64._0_8_ = auVar63._0_8_ + 1;
                    auVar64._8_8_ = auVar63._8_8_ - auVar81._8_8_;
                    auVar55._0_8_ = local_58 + 1;
                    auVar55._8_8_ = lStack_50 - auVar81._8_8_;
                    in_XMM15 = pblendvb(auVar55,auVar64,auVar42);
                    psVar2 = (size_t *)((long)*b + lVar25);
                    *psVar2 = sVar28;
                    psVar2[1] = sVar21;
                    uStack_80 = (ulong)(uint)gap;
                    *(undefined1 (*) [16])((long)*b_00 + lVar25) = auVar69;
                    *(undefined1 (*) [16])((long)*b_01 + lVar25) = auVar70;
                    *(undefined1 (*) [16])((long)*b_02 + lVar25) = auVar64;
                    psVar2 = (size_t *)((long)*ptr + lVar25);
                    *psVar2 = sVar77;
                    psVar2[1] = sVar79;
                    *(undefined1 (*) [16])((long)*b_03 + lVar25) = auVar75;
                    *(undefined1 (*) [16])((long)*b_04 + lVar25) = auVar74;
                    *(undefined1 (*) [16])((long)*b_05 + lVar25) = auVar55;
                    lVar25 = lVar25 + 0x10;
                    local_58 = auVar78._0_8_;
                    lStack_50 = auVar78._8_8_;
                    local_128 = auVar49._0_8_;
                    lStack_120 = auVar49._8_8_;
                    local_1c8._0_8_ = auVar41._0_8_;
                    local_1c8._8_8_ = auVar41._8_8_;
                    sVar77 = sVar46;
                    sVar79 = sVar39;
                    iVar76 = lVar7;
                    lVar58 = lVar12;
                  } while (lVar53 != lVar25);
                  auVar13._8_8_ = 0;
                  auVar13._0_8_ = auVar72._0_8_;
                  local_1c8 = auVar13 << 0x40;
                  auVar69._8_8_ = 0;
                  auVar69._0_8_ = local_1a8._0_8_;
                  local_1a8 = auVar69 << 0x40;
                  auVar70._8_8_ = 0;
                  auVar70._0_8_ = in_XMM15._0_8_;
                  in_XMM15 = auVar70 << 0x40;
                  sVar52 = ptr_06[uVar31 + 1];
                  sVar77 = sVar52 + (*ptr_04)[0];
                  sVar79 = sVar47 + (*ptr_04)[1];
                  uVar31 = uVar31 + 1;
                  auVar56._8_8_ = -(ulong)((long)sVar39 < (long)sVar79);
                  auVar56._0_8_ = -(ulong)((long)sVar46 < (long)sVar77);
                  auVar43._0_8_ = -(ulong)(sVar77 == sVar46);
                  auVar43._8_8_ = -(ulong)(sVar79 == sVar39);
                  auVar43 = auVar43 | auVar56;
                  auVar41 = pblendvb(local_1b8,local_1c8,auVar43);
                  auVar72 = pblendvb(local_1f8,local_1a8,auVar43);
                  auVar65 = pblendvb(auVar65,(undefined1  [16])*ptr_05,auVar43);
                  if ((long)sVar77 < (long)sVar46) {
                    sVar77 = sVar46;
                  }
                  auVar73._8_8_ = 0;
                  auVar73._0_8_ = auVar41._0_8_;
                  auVar73 = auVar73 << 0x40;
                  auVar71._8_8_ = 0;
                  auVar71._0_8_ = auVar72._0_8_;
                  auVar71 = auVar71 << 0x40;
                  auVar15._8_8_ = 0;
                  auVar15._0_8_ = auVar65._0_8_;
                  auVar66 = auVar15 << 0x40;
                  sVar79 = sVar47;
                  if ((long)sVar47 < (long)sVar77) {
                    sVar79 = sVar77;
                  }
                  sVar21 = sVar52;
                  if ((long)sVar52 < (long)sVar20) {
                    sVar21 = sVar20;
                  }
                  auVar44._8_8_ = -(ulong)((long)sVar47 < (long)sVar77);
                  auVar44._0_8_ = -(ulong)((long)sVar52 < (long)sVar20);
                  auVar72 = pblendvb(local_1c8,auVar73,auVar44);
                  auVar65 = pblendvb(local_1a8,auVar71,auVar44);
                  auVar41 = pblendvb(in_XMM15,auVar66,auVar44);
                  lVar25 = 0;
                  lVar58 = local_150;
                  lVar23 = local_158;
                  sVar47 = sVar20;
                  do {
                    sVar46 = sVar21 - (uint)open;
                    sVar79 = sVar79 - (uint)open;
                    sVar52 = sVar47 - uVar38;
                    sVar39 = sVar77 - uStack_80;
                    sVar47 = sVar52;
                    if ((long)sVar52 < (long)sVar46) {
                      sVar47 = sVar46;
                    }
                    sVar77 = sVar39;
                    if ((long)sVar39 < (long)sVar79) {
                      sVar77 = sVar79;
                    }
                    sVar59 = *(size_t *)((long)*ptr + lVar25);
                    sVar62 = *(size_t *)((long)*ptr + lVar25 + 8);
                    sVar21 = *(size_t *)((long)*b + lVar25);
                    if ((long)sVar21 < (long)sVar59) {
                      sVar21 = sVar59;
                    }
                    auVar45._8_8_ = -(ulong)((long)sVar39 < (long)sVar79);
                    auVar45._0_8_ = -(ulong)((long)sVar52 < (long)sVar46);
                    sVar79 = *(size_t *)((long)*b + lVar25 + 8);
                    auVar73 = pblendvb(auVar73,auVar72,auVar45);
                    if ((long)sVar79 < (long)sVar62) {
                      sVar79 = sVar62;
                    }
                    auVar71 = pblendvb(auVar71,auVar65,auVar45);
                    auVar41 = pblendvb(auVar66,auVar41,auVar45);
                    if ((long)sVar21 <= (long)sVar47) {
                      sVar21 = sVar47;
                    }
                    if ((long)sVar79 <= (long)sVar77) {
                      sVar79 = sVar77;
                    }
                    psVar2 = (size_t *)((long)*ptr + lVar25);
                    auVar51._0_8_ = -(ulong)(*psVar2 == sVar21);
                    auVar51._8_8_ = -(ulong)(psVar2[1] == sVar79);
                    auVar57._0_8_ = -(ulong)(sVar21 == sVar47);
                    auVar57._8_8_ = -(ulong)(sVar79 == sVar77);
                    auVar72 = blendvpd(*(undefined1 (*) [16])((long)*b_00 + lVar25),auVar73,auVar57)
                    ;
                    auVar72 = blendvpd(auVar72,*(undefined1 (*) [16])((long)*b_03 + lVar25),auVar51)
                    ;
                    auVar65 = blendvpd(*(undefined1 (*) [16])((long)*b_01 + lVar25),auVar71,auVar57)
                    ;
                    auVar65 = blendvpd(auVar65,*(undefined1 (*) [16])((long)*b_04 + lVar25),auVar51)
                    ;
                    auVar66._0_8_ = auVar41._0_8_ + 1;
                    auVar66._8_8_ = auVar41._8_8_ + 1;
                    auVar41 = blendvpd(*(undefined1 (*) [16])((long)*b_02 + lVar25),auVar66,auVar57)
                    ;
                    auVar41 = blendvpd(auVar41,*(undefined1 (*) [16])((long)*b_05 + lVar25),auVar51)
                    ;
                    psVar2 = (size_t *)((long)*ptr + lVar25);
                    *psVar2 = sVar21;
                    psVar2[1] = sVar79;
                    *(undefined1 (*) [16])((long)*b_03 + lVar25) = auVar72;
                    *(undefined1 (*) [16])((long)*b_04 + lVar25) = auVar65;
                    *(undefined1 (*) [16])((long)*b_05 + lVar25) = auVar41;
                    lVar7 = *((ppVar19->field_4).trace)->trace_del_table;
                    *(int *)(lVar7 + lVar23) = (int)sVar21;
                    *(int *)(lVar7 + lVar58) = (int)sVar79;
                    lVar7 = *(long *)((long)((ppVar19->field_4).trace)->trace_del_table + 8);
                    *(int *)(lVar7 + lVar23) = auVar72._0_4_;
                    uVar8 = extractps(auVar72,2);
                    *(undefined8 *)(lVar7 + lVar58) = uVar8;
                    if ((long)sVar21 <= (long)sVar22) {
                      sVar22 = sVar21;
                    }
                    if ((long)sVar79 <= (long)sStack_130) {
                      sStack_130 = sVar79;
                    }
                    if ((long)local_98 <= (long)sVar21) {
                      local_98 = sVar21;
                    }
                    lVar7 = *(long *)((long)((ppVar19->field_4).trace)->trace_del_table + 0x10);
                    *(int *)(lVar7 + lVar23) = auVar65._0_4_;
                    uVar8 = extractps(auVar65,2);
                    *(undefined8 *)(lVar7 + lVar58) = uVar8;
                    if ((long)sStack_90 <= (long)sVar79) {
                      sStack_90 = sVar79;
                    }
                    if ((long)local_98 <= (long)auVar72._0_8_) {
                      local_98 = auVar72._0_8_;
                    }
                    if ((long)sStack_90 <= (long)auVar72._8_8_) {
                      sStack_90 = auVar72._8_8_;
                    }
                    if ((long)local_98 <= (long)auVar65._0_8_) {
                      local_98 = auVar65._0_8_;
                    }
                    lVar7 = *(long *)((long)((ppVar19->field_4).trace)->trace_del_table + 0x18);
                    *(int *)(lVar7 + lVar23) = auVar41._0_4_;
                    uVar8 = extractps(auVar41,2);
                    *(undefined8 *)(lVar7 + lVar58) = uVar8;
                    if ((long)sStack_90 <= (long)auVar65._8_8_) {
                      sStack_90 = auVar65._8_8_;
                    }
                    if ((long)local_98 <= (long)auVar41._0_8_) {
                      local_98 = auVar41._0_8_;
                    }
                    if ((long)sStack_90 <= (long)auVar41._8_8_) {
                      sStack_90 = auVar41._8_8_;
                    }
                    lVar25 = lVar25 + 0x10;
                    lVar58 = lVar58 + uVar36 * 4;
                    lVar23 = lVar23 + uVar36 * 4;
                  } while (lVar53 != lVar25);
                  local_150 = local_150 + 4;
                  local_158 = local_158 + 4;
                } while (uVar31 != uVar24);
                alVar82 = ptr[uVar29];
                auVar60 = alVar82._0_12_;
                alVar83 = b_03[uVar29];
                auVar54 = alVar83._0_12_;
                alVar84 = b_04[uVar29];
                auVar48 = alVar84._0_12_;
                alVar85 = b_05[uVar29];
                auVar40 = alVar85._0_12_;
                if (iVar34 / iVar30 < 1) {
                  do {
                    auVar9._8_8_ = 0;
                    auVar9._0_8_ = alVar82[0];
                    alVar82 = (__m128i)(auVar9 << 0x40);
                    auVar60 = alVar82._0_12_;
                    auVar10._8_8_ = 0;
                    auVar10._0_8_ = alVar83[0];
                    alVar83 = (__m128i)(auVar10 << 0x40);
                    auVar54 = alVar83._0_12_;
                    auVar11._8_8_ = 0;
                    auVar11._0_8_ = alVar84[0];
                    alVar84 = (__m128i)(auVar11 << 0x40);
                    auVar48 = alVar84._0_12_;
                    auVar14._8_8_ = 0;
                    auVar14._0_8_ = alVar85[0];
                    alVar85 = (__m128i)(auVar14 << 0x40);
                    auVar40 = alVar85._0_12_;
                  } while (iVar34 / iVar30 < 0);
                }
                auVar67._8_8_ = -(ulong)((long)sStack_130 <= (long)uVar35);
                auVar67._0_8_ = -(ulong)((long)sVar22 <= (long)uVar35);
                auVar68._8_8_ = -(ulong)((long)len < (long)sStack_90);
                auVar68._0_8_ = -(ulong)((long)len < (long)local_98);
                auVar68 = auVar68 | auVar67;
                if ((((((((((((((((auVar68 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                                 (auVar68 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                                && (auVar68 >> 0x17 & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                               (auVar68 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                              && (auVar68 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                             && (auVar68 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                            && (auVar68 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                           && (auVar68 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar68 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar68 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar68 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar68 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar68 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar68 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar68 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar68[0xf]) {
                  iVar27 = auVar60._8_4_;
                  iVar30 = auVar54._8_4_;
                  iVar33 = auVar48._8_4_;
                  iVar18 = auVar40._8_4_;
                }
                else {
                  *(byte *)&ppVar19->flag = (byte)ppVar19->flag | 0x40;
                  iVar27 = 0;
                  iVar30 = 0;
                  iVar33 = 0;
                  iVar18 = 0;
                  iVar16 = 0;
                  iVar34 = 0;
                }
                ppVar19->score = iVar27;
                ppVar19->end_query = iVar34;
                ppVar19->end_ref = iVar16;
                ((ppVar19->field_4).stats)->matches = iVar30;
                ((ppVar19->field_4).stats)->similar = iVar33;
                ((ppVar19->field_4).stats)->length = iVar18;
                parasail_free(ptr_06);
                parasail_free(ptr_05);
                parasail_free(ptr_04);
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(b_05);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(ptr);
                parasail_free(b_02);
                parasail_free(b_01);
                parasail_free(b_00);
                parasail_free(b);
                return ppVar19;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile64.score;
    pvPm = (__m128i*)profile->profile64.matches;
    pvPs = (__m128i*)profile->profile64.similar;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi64x_rpl(segLen), 8);
    vNegInfFront = _mm_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi64(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_sub_epi64(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_sub_epi64(vGapper, vGapE);
            vGapperL = _mm_add_epi64(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 8);
        vHpM = _mm_slli_si128(vHpM, 8);
        vHpS = _mm_slli_si128(vHpS, 8);
        vHpL = _mm_slli_si128(vHpL, 8);
        vHp = _mm_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_sub_epi64(vH, vGapO);
            vE_ext = _mm_sub_epi64(vE, vGapE);
            case1 = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_add_epi64(vEL, vOne);
            vGapper = _mm_add_epi64(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi64_rpl(vF, vGapper),
                    _mm_cmpeq_epi64(vF, vGapper));
            vF = _mm_max_epi64_rpl(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi64(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_add_epi64(vHp, vW);
            vHpM = _mm_add_epi64(vHpM, vWM);
            vHpS = _mm_add_epi64(vHpS, vWS);
            vHpL = _mm_add_epi64(vHpL, vOne);
            case1 = _mm_cmpgt_epi64_rpl(vE, vHp);
            vHt = _mm_max_epi64_rpl(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 8);
        vHtM = _mm_slli_si128(vHtM, 8);
        vHtS = _mm_slli_si128(vHtS, 8);
        vHtL = _mm_slli_si128(vHtL, 8);
        vHt = _mm_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_add_epi64(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi64_rpl(vGapper, vF),
                _mm_cmpeq_epi64(vGapper, vF));
        vF = _mm_max_epi64_rpl(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_add_epi64(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 8);
            __m128i vFtM = _mm_slli_si128(vFM, 8);
            __m128i vFtS = _mm_slli_si128(vFS, 8);
            __m128i vFtL = _mm_slli_si128(vFL, 8);
            vFt = _mm_add_epi64(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi64_rpl(vFt, vF),
                    _mm_cmpeq_epi64(vFt, vF));
            vF = _mm_max_epi64_rpl(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_add_epi64(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 8);
        vFM = _mm_slli_si128(vFM, 8);
        vFS = _mm_slli_si128(vFS, 8);
        vFL = _mm_slli_si128(vFL, 8);
        vF = _mm_add_epi64(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi64_rpl(vF, vHt);
        vH = _mm_max_epi64_rpl(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_sub_epi64(vH, vGapO);
            vF_ext = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_add_epi64(vFL, vOne);
            vH = _mm_max_epi64_rpl(vHp, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            case1 = _mm_cmpeq_epi64(vH, vHp);
            case2 = _mm_cmpeq_epi64(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
                vHM = _mm_slli_si128(vHM, 8);
                vHS = _mm_slli_si128(vHS, 8);
                vHL = _mm_slli_si128(vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
            result->stats->rowcols->length_row[j] = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 8);
            vHM = _mm_slli_si128(vHM, 8);
            vHS = _mm_slli_si128(vHS, 8);
            vHL = _mm_slli_si128(vHL, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        matches = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
        similar = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
        length = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}